

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldBase::UnsafeShallowSwap(MapFieldBase *this,MapFieldBase *other)

{
  State SVar1;
  RepeatedPtrField<google::protobuf::Message> *pRVar2;
  LogMessage *other_00;
  Arena *pAVar3;
  Arena *pAVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  pAVar3 = this->arena_;
  pAVar4 = other->arena_;
  if (pAVar3 != pAVar4) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
               ,100);
    other_00 = LogMessage::operator<<(&local_50,"CHECK failed: (arena_) == (other->arena_): ");
    LogFinisher::operator=(&local_51,other_00);
    LogMessage::~LogMessage(&local_50);
    pAVar3 = this->arena_;
    pAVar4 = other->arena_;
  }
  this->arena_ = pAVar4;
  other->arena_ = pAVar3;
  pRVar2 = this->repeated_field_;
  this->repeated_field_ = other->repeated_field_;
  other->repeated_field_ = pRVar2;
  SVar1 = (other->state_)._M_i;
  (other->state_)._M_i = (this->state_)._M_i;
  (this->state_)._M_i = SVar1;
  return;
}

Assistant:

void MapFieldBase::UnsafeShallowSwap(MapFieldBase* other) {
  GOOGLE_DCHECK_EQ(arena_, other->arena_);
  InternalSwap(other);
}